

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O2

bool __thiscall Time::step(Time *this)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  
  bVar3 = 1;
  bVar2 = false;
  while (((bVar3 & 1) != 0 && (bVar2 == false))) {
    uVar5 = (ulong)((long)(this->timeObjects).
                          super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->timeObjects).
                         super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    bVar2 = true;
    bVar3 = 0;
    while( true ) {
      iVar1 = (int)uVar5;
      uVar4 = iVar1 - 1;
      uVar5 = (ulong)uVar4;
      if (iVar1 == 0) break;
      iVar1 = (*(this->timeObjects).
                super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                super__Vector_impl_data._M_start[(int)uVar4]->_vptr_TimeDependent[5])();
      if ((char)iVar1 == '\0') {
        (*(this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
          _M_impl.super__Vector_impl_data._M_start[(int)uVar4]->_vptr_TimeDependent[3])();
        iVar1 = (*(this->timeObjects).
                  super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar4]->_vptr_TimeDependent[5])();
        bVar3 = bVar3 | (byte)iVar1;
        bVar2 = (bool)(bVar2 & (byte)iVar1);
      }
    }
  }
  if (bVar2 != false) {
    this->timePassed = this->dt + this->timePassed;
  }
  return bVar2;
}

Assistant:

bool Time::step()
{
	// saving flags for update success
	bool someObjectsUpdated = true;
	bool allObjectsUpdated = false;
		
	// while some objects are waiting, but some can still be updated
	while (someObjectsUpdated && !allObjectsUpdated) {
		someObjectsUpdated = false;
		allObjectsUpdated = true;
		
		// try to update all waiting objects
		for (int i=timeObjects.size()-1; i+1; --i) {
			if (!timeObjects[i]->isNextStatePrepared()) {
				
				// update object
				timeObjects[i]->prepareNextState();
				
				// record success of updating
				if (timeObjects[i]->isNextStatePrepared())
					someObjectsUpdated = true;
				else
					allObjectsUpdated = false;
			}
		}
	}
	
	if (allObjectsUpdated)
		timePassed += dt;
	
	return allObjectsUpdated;
}